

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O3

void Tim_ManSetPreviousTravIdBoxInputs(Tim_Man_t *p,int iBox)

{
  int iVar1;
  void *pvVar2;
  Tim_Obj_t *pTVar3;
  long lVar4;
  long lVar5;
  
  if ((-1 < iBox) && (iBox < p->vBoxes->nSize)) {
    pvVar2 = p->vBoxes->pArray[(uint)iBox];
    lVar4 = (long)*(int *)((long)pvVar2 + 8);
    if ((0 < lVar4) && (pTVar3 = p->pCos, pTVar3 != (Tim_Obj_t *)0x0)) {
      iVar1 = p->nTravIds;
      lVar5 = 0;
      do {
        pTVar3[*(int *)((long)pvVar2 + lVar5 * 4 + 0x1c)].TravId = iVar1 + -1;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Tim_ManSetPreviousTravIdBoxInputs( Tim_Man_t * p, int iBox )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    int i;
    pBox = Tim_ManBox( p, iBox );
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        pObj->TravId = p->nTravIds - 1;
}